

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O1

edata_t * hpa_alloc(tsdn_t *tsdn,pai_t *self,size_t size,size_t alignment,_Bool zero,_Bool guarded,
                   _Bool frequent_reuse,_Bool *deferred_work_generated)

{
  edata_list_active_t local_10;
  
  if (0x1000 < alignment || zero) {
    return (edata_t *)0x0;
  }
  local_10.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
  hpa_alloc_batch(tsdn,self,size,1,&local_10,frequent_reuse,deferred_work_generated);
  return local_10.head.qlh_first.qlh_first;
}

Assistant:

static edata_t *
hpa_alloc(tsdn_t *tsdn, pai_t *self, size_t size, size_t alignment, bool zero,
    bool guarded, bool frequent_reuse, bool *deferred_work_generated) {
	assert((size & PAGE_MASK) == 0);
	assert(!guarded);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/* We don't handle alignment or zeroing for now. */
	if (alignment > PAGE || zero) {
		return NULL;
	}
	/*
	 * An alloc with alignment == PAGE and zero == false is equivalent to a
	 * batch alloc of 1.  Just do that, so we can share code.
	 */
	edata_list_active_t results;
	edata_list_active_init(&results);
	size_t nallocs = hpa_alloc_batch(tsdn, self, size, /* nallocs */ 1,
	    &results, frequent_reuse, deferred_work_generated);
	assert(nallocs == 0 || nallocs == 1);
	edata_t *edata = edata_list_active_first(&results);
	return edata;
}